

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolb.c
# Opt level: O0

int ffgclb(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,
          long elemincre,int nultyp,uchar nulval,uchar *array,char *nularray,int *anynul,int *status
          )

{
  long lVar1;
  long local_72b8;
  long local_72a8;
  long local_7298;
  u_tag u;
  void *buffer;
  double cbuff [3600];
  char snull [20];
  char local_1a8 [8];
  char message [81];
  char local_148 [8];
  char tform [20];
  LONGLONG maxelem;
  LONGLONG rowincre;
  LONGLONG next;
  LONGLONG remain;
  LONGLONG rownum;
  LONGLONG rowlen;
  LONGLONG tnull;
  LONGLONG readptr;
  LONGLONG elemnum;
  LONGLONG startpos;
  LONGLONG repeat;
  int local_d0;
  int readcheck;
  int nulcheck;
  int convert;
  long xwidth;
  long ii;
  long ntodo;
  long incre;
  long twidth;
  int local_98;
  int decimals;
  int xcode;
  int hdutype;
  int maxelem2;
  int tcode;
  double dtemp;
  double power;
  double zero;
  double scale;
  long elemincre_local;
  LONGLONG nelem_local;
  LONGLONG firstelem_local;
  LONGLONG firstrow_local;
  fitsfile *pfStack_40;
  int colnum_local;
  fitsfile *fptr_local;
  
  dtemp = 1.0;
  repeat._4_4_ = 0x10;
  if ((*status < 1) && (nelem != 0)) {
    if (anynul != (int *)0x0) {
      *anynul = 0;
    }
    scale = (double)elemincre;
    elemincre_local = nelem;
    nelem_local = firstelem;
    firstelem_local = firstrow;
    firstrow_local._4_4_ = colnum;
    pfStack_40 = fptr;
    if (nultyp == 2) {
      memset(nularray,0,nelem);
    }
    if ((long)scale < 0) {
      repeat._4_4_ = repeat._4_4_ + -1;
    }
    ffgcprll(pfStack_40,firstrow_local._4_4_,firstelem_local,nelem_local,elemincre_local,
             repeat._4_4_,&zero,&power,local_148,&incre,&hdutype,&xcode,&elemnum,&readptr,&ntodo,
             &startpos,&rownum,&decimals,&rowlen,(char *)(cbuff + 0xe0f),status);
    register0x00000000 = (long)xcode;
    if ((hdutype == 0xe) && (scale == 4.94065645841247e-324)) {
      ffgcll(pfStack_40,firstrow_local._4_4_,firstelem_local,nelem_local,elemincre_local,nultyp,
             nulval,(char *)array,nularray,anynul,status);
      fptr_local._4_4_ = *status;
    }
    else if (*status < 1) {
      ntodo = (long)scale * ntodo;
      if ((hdutype == 0x10) && (decimals == 1)) {
        ffasfm(local_148,&local_98,(long *)&nulcheck,(int *)((long)&twidth + 4),status);
        for (xwidth = 0; xwidth < twidth._4_4_; xwidth = xwidth + 1) {
          dtemp = dtemp * 10.0;
        }
      }
      local_d0 = nultyp;
      if ((nultyp == 1) && (nulval == '\0')) {
        local_d0 = 0;
      }
      else if ((hdutype % 10 == 1) && (rowlen == 0x4995cdd1)) {
        local_d0 = 0;
      }
      else if ((hdutype == 0x15) && ((0x7fff < rowlen || (rowlen < -0x8000)))) {
        local_d0 = 0;
      }
      else if ((hdutype == 0xb) && ((0xff < rowlen || (rowlen < 0)))) {
        local_d0 = 0;
      }
      else if ((hdutype == 0x10) && (cbuff[0xe0f]._0_1_ == '\x01')) {
        local_d0 = 0;
      }
      readcheck = 1;
      if (hdutype == 0xb) {
        if (elemincre_local < 0x7fffffff) {
          stack0xfffffffffffffed0 = elemincre_local;
        }
        else {
          stack0xfffffffffffffed0 = 0x7fffffff;
        }
        if ((((local_d0 == 0) && (zero == 1.0)) && (!NAN(zero))) &&
           ((power == 0.0 && (!NAN(power))))) {
          readcheck = 0;
        }
      }
      next = elemincre_local;
      rowincre = 0;
      remain = 0;
      while (next != 0) {
        if (next < stack0xfffffffffffffed0) {
          local_7298 = next;
        }
        else {
          local_7298 = stack0xfffffffffffffed0;
        }
        if ((long)scale < 0) {
          if (local_7298 < readptr / -(long)scale + 1) {
            local_72b8 = local_7298;
          }
          else {
            local_72b8 = readptr / -(long)scale + 1;
          }
          ii = local_72b8;
        }
        else {
          if (local_7298 < ((startpos - readptr) + -1) / (long)scale + 1) {
            local_72a8 = local_7298;
          }
          else {
            local_72a8 = ((startpos - readptr) + -1) / (long)scale + 1;
          }
          ii = local_72a8;
        }
        tnull = elemnum + remain * rownum + readptr * (ntodo / (long)scale);
        if (hdutype == 0xb) {
          ffgi1b(pfStack_40,tnull,ii,ntodo,array + rowincre,status);
          if (readcheck != 0) {
            fffi1i1(array + rowincre,ii,zero,power,local_d0,(uchar)rowlen,nulval,nularray + rowincre
                    ,anynul,array + rowincre,status);
          }
        }
        else if (hdutype == 0x10) {
          ffmbyt(pfStack_40,tnull,0,status);
          if (ntodo == incre) {
            ffgbyt(pfStack_40,ii * incre,&buffer,status);
          }
          else {
            ffgbytoff(pfStack_40,incre,ii,ntodo - incre,&buffer,status);
          }
          fffstri1((char *)&buffer,ii,zero,power,incre,dtemp,local_d0,(char *)(cbuff + 0xe0f),nulval
                   ,nularray + rowincre,anynul,array + rowincre,status);
        }
        else if (hdutype == 0x15) {
          ffgi2b(pfStack_40,tnull,ii,ntodo,(short *)&buffer,status);
          fffi2i1((short *)&buffer,ii,zero,power,local_d0,(short)rowlen,nulval,nularray + rowincre,
                  anynul,array + rowincre,status);
        }
        else if (hdutype == 0x29) {
          ffgi4b(pfStack_40,tnull,ii,ntodo,(int *)&buffer,status);
          fffi4i1((int *)&buffer,ii,zero,power,local_d0,(int)rowlen,nulval,nularray + rowincre,
                  anynul,array + rowincre,status);
        }
        else if (hdutype == 0x2a) {
          ffgr4b(pfStack_40,tnull,ii,ntodo,(float *)&buffer,status);
          fffr4i1((float *)&buffer,ii,zero,power,local_d0,nulval,nularray + rowincre,anynul,
                  array + rowincre,status);
        }
        else if (hdutype == 0x51) {
          ffgi8b(pfStack_40,tnull,ii,ntodo,(long *)&buffer,status);
          fffi8i1((LONGLONG *)&buffer,ii,zero,power,local_d0,rowlen,nulval,nularray + rowincre,
                  anynul,array + rowincre,status);
        }
        else {
          if (hdutype != 0x52) {
            snprintf(local_1a8,0x51,"Cannot read bytes from column %d which has format %s",
                     (ulong)firstrow_local._4_4_,local_148);
            ffpmsg(local_1a8);
            if (decimals == 1) {
              *status = 0x137;
              return 0x137;
            }
            *status = 0x138;
            return 0x138;
          }
          ffgr8b(pfStack_40,tnull,ii,ntodo,(double *)&buffer,status);
          fffr8i1((double *)&buffer,ii,zero,power,local_d0,nulval,nularray + rowincre,anynul,
                  array + rowincre,status);
        }
        if (0 < *status) {
          _maxelem2 = (double)rowincre;
          if (decimals < 1) {
            snprintf(local_1a8,0x51,"Error reading elements %.0f thru %.0f from image (ffgclb).",
                     _maxelem2 + 1.0,_maxelem2 + (double)ii);
          }
          else {
            snprintf(local_1a8,0x51,"Error reading elements %.0f thru %.0f from column %d (ffgclb)."
                     ,_maxelem2 + 1.0,_maxelem2 + (double)ii,(ulong)firstrow_local._4_4_);
          }
          ffpmsg(local_1a8);
          return *status;
        }
        next = next - ii;
        if (next != 0) {
          rowincre = ii + rowincre;
          readptr = readptr + ii * (long)scale;
          if (readptr < startpos) {
            if (readptr < 0) {
              lVar1 = (-1 - readptr) / startpos + 1;
              remain = remain - lVar1;
              readptr = lVar1 * startpos + readptr;
            }
          }
          else {
            remain = readptr / startpos + remain;
            readptr = readptr - (readptr / startpos) * startpos;
          }
        }
      }
      if (*status == -0xb) {
        ffpmsg("Numerical overflow during type conversion while reading FITS data.");
        *status = 0x19c;
      }
      fptr_local._4_4_ = *status;
    }
    else {
      fptr_local._4_4_ = *status;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgclb( fitsfile *fptr,   /* I - FITS file pointer                       */
            int  colnum,      /* I - number of column to read (1 = 1st col)  */
            LONGLONG  firstrow,   /* I - first row to read (1 = 1st row)         */
            LONGLONG firstelem,  /* I - first vector element to read (1 = 1st)  */
            LONGLONG  nelem,      /* I - number of values to read                */
            long  elemincre,  /* I - pixel increment; e.g., 2 = every other  */
            int   nultyp,     /* I - null value handling code:               */
                              /*     1: set undefined pixels = nulval        */
                              /*     2: set nularray=1 for undefined pixels  */
            unsigned char nulval, /* I - value for null pixels if nultyp = 1 */
            unsigned char *array, /* O - array of values that are read       */
            char *nularray,   /* O - array of flags = 1 if nultyp = 2        */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from a column in the current FITS HDU.
  The column number may refer to a real column in an ASCII or binary table, 
  or it may refer be a virtual column in a 1 or more grouped FITS primary
  array or image extension.  FITSIO treats a primary array as a binary table
  with 2 vector columns: the first column contains the group parameters (often
  with length = 0) and the second column contains the array of image pixels.
  Each row of the table represents a group in the case of multigroup FITS
  images.

  The output array of values will be converted from the datatype of the column 
  and will be scaled by the FITS TSCALn and TZEROn values if necessary.
*/
{
    double scale, zero, power = 1., dtemp;
    int tcode, maxelem2, hdutype, xcode, decimals;
    long twidth, incre, ntodo;
    long ii, xwidth;
    int convert, nulcheck, readcheck = 16; /* see note below on readcheck */
    LONGLONG repeat, startpos, elemnum, readptr, tnull;
    LONGLONG rowlen, rownum, remain, next, rowincre, maxelem;
    char tform[20];
    char message[FLEN_ERRMSG];
    char snull[20];   /*  the FITS null value if reading from ASCII table  */

    double cbuff[DBUFFSIZE / sizeof(double)]; /* align cbuff on word boundary */
    void *buffer;

    union u_tag {
       char charval;
       unsigned char ucharval;
    } u;

    if (*status > 0 || nelem == 0)  /* inherit input status value if > 0 */
        return(*status);

    buffer = cbuff;

    if (anynul)
        *anynul = 0;

    if (nultyp == 2)      
       memset(nularray, 0, (size_t) nelem);   /* initialize nullarray */

    /*---------------------------------------------------*/
    /*  Check input and get parameters about the column: */
    /*---------------------------------------------------*/
    if (elemincre < 0)
        readcheck -= 1;  /* don't do range checking in this case */

    /* IMPORTANT NOTE: that the special case of using this subroutine
       to read bytes from a character column are handled internally
       by the call to ffgcprll() below.  It will adjust the effective
       *tcode, repeats, etc, to appear as a TBYTE column. */

    /* Note that readcheck = 16 is equivalent to readcheck = 0 
       and readcheck = 15 is equivalent to readcheck = -1, 
       but either of those settings allow TSTRINGS to be 
       treated as TBYTE vectors, but with full error checking */

    ffgcprll( fptr, colnum, firstrow, firstelem, nelem, readcheck, &scale, &zero,
         tform, &twidth, &tcode, &maxelem2, &startpos, &elemnum, &incre,
         &repeat, &rowlen, &hdutype, &tnull, snull, status);
    maxelem = maxelem2;

    /* special case */
    if (tcode == TLOGICAL && elemincre == 1)
    {
        u.ucharval = nulval;
        ffgcll(fptr, colnum, firstrow, firstelem, nelem, nultyp,
               u.charval, (char *) array, nularray, anynul, status);

        return(*status);
    }

    if (*status > 0)
        return(*status);
        
    incre *= elemincre;   /* multiply incre to just get every nth pixel */

    if (tcode == TSTRING && hdutype == ASCII_TBL) /* setup for ASCII tables */
    {
      /* get the number of implied decimal places if no explicit decmal point */
      ffasfm(tform, &xcode, &xwidth, &decimals, status); 
      for(ii = 0; ii < decimals; ii++)
        power *= 10.;
    }
    /*------------------------------------------------------------------*/
    /*  Decide whether to check for null values in the input FITS file: */
    /*------------------------------------------------------------------*/
    nulcheck = nultyp; /* by default, check for null values in the FITS file */

    if (nultyp == 1 && nulval == 0)
       nulcheck = 0;    /* calling routine does not want to check for nulls */

    else if (tcode%10 == 1 &&        /* if reading an integer column, and  */ 
            tnull == NULL_UNDEFINED) /* if a null value is not defined,    */
            nulcheck = 0;            /* then do not check for null values. */

    else if (tcode == TSHORT && (tnull > SHRT_MAX || tnull < SHRT_MIN) )
            nulcheck = 0;            /* Impossible null value */

    else if (tcode == TBYTE && (tnull > 255 || tnull < 0) )
            nulcheck = 0;            /* Impossible null value */

    else if (tcode == TSTRING && snull[0] == ASCII_NULL_UNDEFINED)
         nulcheck = 0;

    /*----------------------------------------------------------------------*/
    /*  If FITS column and output data array have same datatype, then we do */
    /*  not need to use a temporary buffer to store intermediate datatype.  */
    /*----------------------------------------------------------------------*/
    convert = 1;
    if (tcode == TBYTE) /* Special Case:                        */
    {                             /* no type convertion required, so read */
                                  /* data directly into output buffer.    */

        if (nelem < (LONGLONG)INT32_MAX) {
            maxelem = nelem;
        } else {
            maxelem = INT32_MAX;
        }

        if (nulcheck == 0 && scale == 1. && zero == 0.)
            convert = 0;  /* no need to scale data or find nulls */
    }

    /*---------------------------------------------------------------------*/
    /*  Now read the pixels from the FITS column. If the column does not   */
    /*  have the same datatype as the output array, then we have to read   */
    /*  the raw values into a temporary buffer (of limited size).  In      */
    /*  the case of a vector colum read only 1 vector of values at a time  */
    /*  then skip to the next row if more values need to be read.          */
    /*  After reading the raw values, then call the fffXXYY routine to (1) */
    /*  test for undefined values, (2) convert the datatype if necessary,  */
    /*  and (3) scale the values by the FITS TSCALn and TZEROn linear      */
    /*  scaling parameters.                                                */
    /*---------------------------------------------------------------------*/
    remain = nelem;           /* remaining number of values to read */
    next = 0;                 /* next element in array to be read   */
    rownum = 0;               /* row number, relative to firstrow   */

    while (remain)
    {
        /* limit the number of pixels to read at one time to the number that
           will fit in the buffer or to the number of pixels that remain in
           the current vector, which ever is smaller.
        */
        ntodo = (long) minvalue(remain, maxelem);
        if (elemincre >= 0)
        {
          ntodo = (long) minvalue(ntodo, ((repeat - elemnum - 1)/elemincre +1));
        }
        else
        {
          ntodo = (long) minvalue(ntodo, (elemnum/(-elemincre) +1));
        }

        readptr = startpos + ((LONGLONG)rownum * rowlen) + (elemnum * (incre / elemincre));

        switch (tcode) 
        {
            case (TBYTE):
                ffgi1b(fptr, readptr, ntodo, incre, &array[next], status);
                if (convert)
                    fffi1i1(&array[next], ntodo, scale, zero, nulcheck, 
                    (unsigned char) tnull, nulval, &nularray[next], anynul, 
                           &array[next], status);
                break;
            case (TSHORT):
                ffgi2b(fptr, readptr, ntodo, incre, (short *) buffer, status);
                fffi2i1((short  *) buffer, ntodo, scale, zero, nulcheck, 
                       (short) tnull, nulval, &nularray[next], anynul, 
                       &array[next], status);
                break;
            case (TLONG):
                ffgi4b(fptr, readptr, ntodo, incre, (INT32BIT *) buffer,
                       status);
                fffi4i1((INT32BIT *) buffer, ntodo, scale, zero, nulcheck, 
                       (INT32BIT) tnull, nulval, &nularray[next], anynul, 
                       &array[next], status);
                break;
            case (TLONGLONG):
                ffgi8b(fptr, readptr, ntodo, incre, (long *) buffer, status);
                fffi8i1( (LONGLONG *) buffer, ntodo, scale, zero, 
                           nulcheck, tnull, nulval, &nularray[next], 
                            anynul, &array[next], status);
                break;
            case (TFLOAT):
                ffgr4b(fptr, readptr, ntodo, incre, (float  *) buffer, status);
                fffr4i1((float  *) buffer, ntodo, scale, zero, nulcheck, 
                       nulval, &nularray[next], anynul, 
                       &array[next], status);
                break;
            case (TDOUBLE):
                ffgr8b(fptr, readptr, ntodo, incre, (double *) buffer, status);
                fffr8i1((double *) buffer, ntodo, scale, zero, nulcheck, 
                          nulval, &nularray[next], anynul, 
                          &array[next], status);
                break;
            case (TSTRING):
                ffmbyt(fptr, readptr, REPORT_EOF, status);
       
                if (incre == twidth)    /* contiguous bytes */
                     ffgbyt(fptr, ntodo * twidth, buffer, status);
                else
                     ffgbytoff(fptr, twidth, ntodo, incre - twidth, buffer,
                               status);

                /* interpret the string as an ASCII formated number */
                fffstri1((char *) buffer, ntodo, scale, zero, twidth, power,
                      nulcheck, snull, nulval, &nularray[next], anynul,
                      &array[next], status);
                break;

            default:  /*  error trap for invalid column format */
                snprintf(message, FLEN_ERRMSG,
                   "Cannot read bytes from column %d which has format %s",
                    colnum, tform);
                ffpmsg(message);
                if (hdutype == ASCII_TBL)
                    return(*status = BAD_ATABLE_FORMAT);
                else
                    return(*status = BAD_BTABLE_FORMAT);

        } /* End of switch block */

        /*-------------------------*/
        /*  Check for fatal error  */
        /*-------------------------*/
        if (*status > 0)  /* test for error during previous read operation */
        {
	  dtemp = (double) next;
          if (hdutype > 0)
            snprintf(message,FLEN_ERRMSG,
            "Error reading elements %.0f thru %.0f from column %d (ffgclb).",
              dtemp+1., dtemp+ntodo, colnum);
          else
            snprintf(message,FLEN_ERRMSG,
            "Error reading elements %.0f thru %.0f from image (ffgclb).",
              dtemp+1., dtemp+ntodo);

         ffpmsg(message);
         return(*status);
        }

        /*--------------------------------------------*/
        /*  increment the counters for the next loop  */
        /*--------------------------------------------*/
        remain -= ntodo;
        if (remain)
        {
            next += ntodo;
            elemnum = elemnum + (ntodo * elemincre);

            if (elemnum >= repeat)  /* completed a row; start on later row */
            {
                rowincre = elemnum / repeat;
                rownum += rowincre;
                elemnum = elemnum - (rowincre * repeat);
            }
            else if (elemnum < 0)  /* completed a row; start on a previous row */
            {
                rowincre = (-elemnum - 1) / repeat + 1;
                rownum -= rowincre;
                elemnum = (rowincre * repeat) + elemnum;
            }
        }
    }  /*  End of main while Loop  */


    /*--------------------------------*/
    /*  check for numerical overflow  */
    /*--------------------------------*/
    if (*status == OVERFLOW_ERR)
    {
        ffpmsg(
        "Numerical overflow during type conversion while reading FITS data.");
        *status = NUM_OVERFLOW;
    }

    return(*status);
}